

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  long in_RCX;
  string *in_RDX;
  Arena *in_RSI;
  long *in_RDI;
  
  if ((in_RCX == 0) && ((Arena *)*in_RDI != in_RSI)) {
    Destroy((ArenaStringPtr *)in_RSI,in_RDX,(Arena *)0x0);
  }
  if (in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    *in_RDI = (long)in_RSI;
  }
  else {
    *in_RDI = (long)in_RDX;
    if (in_RCX != 0) {
      Arena::Own<std::__cxx11::string>(in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

inline void SetAllocated(const ::std::string* default_value,
                           ::std::string* value, Arena* arena) {
    if (arena == NULL && ptr_ != default_value) {
      Destroy(default_value, arena);
    }
    if (value != NULL) {
      ptr_ = value;
      if (arena != NULL) {
        arena->Own(value);
      }
    } else {
      ptr_ = const_cast< ::std::string*>(default_value);
    }
  }